

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O1

void __thiscall PatternModel::setCursorAbsoluteColumn(PatternModel *this,int absolute)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int track;
  
  lVar2 = 0xdc;
  track = 0;
  do {
    iVar1 = *(int *)(&this->super_QObject + lVar2);
    iVar3 = 0;
    if (iVar1 <= absolute) {
      iVar3 = iVar1;
    }
    iVar3 = absolute - iVar3;
    if (absolute < iVar1) goto LAB_0016d09b;
    lVar2 = lVar2 + 4;
    track = track + 1;
    absolute = iVar3;
  } while (lVar2 != 0xec);
  track = 3;
LAB_0016d09b:
  setCursorTrack(this,track);
  setCursorColumn(this,iVar3);
  return;
}

Assistant:

void PatternModel::setCursorAbsoluteColumn(int absolute) {
    // find the track
    int track = -1;
    for (auto max : mMaxColumns) {
        ++track;
        if (absolute < max) {
            break;
        }
        absolute -= max;
    }

    setCursorTrack(track);
    setCursorColumn(absolute);
}